

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O0

CURLcode on_resp_header(Curl_cfilter *cf,Curl_easy *data,h1_tunnel_state_conflict *ts,char *header)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  _Bool _Var5;
  int iVar6;
  char *local_58;
  char *p;
  char *auth;
  SingleRequest *pSStack_40;
  _Bool proxy;
  SingleRequest *k;
  char *pcStack_30;
  CURLcode result;
  char *header_local;
  h1_tunnel_state_conflict *ts_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  k._4_4_ = CURLE_OK;
  pSStack_40 = &data->req;
  pcStack_30 = header;
  header_local = (char *)ts;
  ts_local = (h1_tunnel_state_conflict *)data;
  data_local = (Curl_easy *)cf;
  iVar6 = curl_strnequal(header,"WWW-Authenticate:",0x11);
  if (((iVar6 == 0) || (pSStack_40->httpcode != 0x191)) &&
     ((iVar6 = curl_strnequal(pcStack_30,"Proxy-authenticate:",0x13), iVar6 == 0 ||
      (pSStack_40->httpcode != 0x197)))) {
    iVar6 = curl_strnequal(pcStack_30,"Content-Length:",0xf);
    if (iVar6 == 0) {
      _Var5 = Curl_compareheader(pcStack_30,"Connection:",0xb,"close",5);
      if (_Var5) {
        header_local[0xac] = header_local[0xac] & 0xfdU | 2;
      }
      else {
        iVar6 = curl_strnequal(pcStack_30,"Transfer-Encoding:",0x12);
        if (iVar6 == 0) {
          _Var5 = Curl_compareheader(pcStack_30,"Proxy-Connection:",0x11,"close",5);
          if (_Var5) {
            header_local[0xac] = header_local[0xac] & 0xfdU | 2;
          }
          else {
            iVar6 = strncmp(pcStack_30,"HTTP/1.",7);
            if (((iVar6 == 0) &&
                ((((pcStack_30[7] == '0' || (pcStack_30[7] == '1')) && (pcStack_30[8] == ' ')) &&
                 (('/' < pcStack_30[9] && (pcStack_30[9] < ':')))))) &&
               (('/' < pcStack_30[10] &&
                (((pcStack_30[10] < ':' && ('/' < pcStack_30[0xb])) &&
                 ((pcStack_30[0xb] < ':' && ((pcStack_30[0xc] < '0' || ('9' < pcStack_30[0xc])))))))
                ))) {
              iVar6 = (pcStack_30[9] + -0x30) * 100 + (pcStack_30[10] + -0x30) * 10 +
                      pcStack_30[0xb] + -0x30;
              pSStack_40->httpcode = iVar6;
              *(int *)&ts_local[0x1c].ch.field_0x44 = iVar6;
            }
          }
        }
        else if (pSStack_40->httpcode / 100 == 2) {
          if (((ts_local != (h1_tunnel_state_conflict *)0x0) &&
              ((*(ulong *)(ts_local[0xe].ch.hexbuffer + 0xb) >> 0x1e & 1) != 0)) &&
             ((lVar3._0_1_ = ts_local[0x1b].ch.hexindex,
              lVar3._1_1_ = ts_local[0x1b].ch.hexbuffer[0],
              lVar3._2_1_ = ts_local[0x1b].ch.hexbuffer[1],
              lVar3._3_1_ = ts_local[0x1b].ch.hexbuffer[2],
              lVar3._4_1_ = ts_local[0x1b].ch.hexbuffer[3],
              lVar3._5_1_ = ts_local[0x1b].ch.hexbuffer[4],
              lVar3._6_1_ = ts_local[0x1b].ch.hexbuffer[5],
              lVar3._7_1_ = ts_local[0x1b].ch.hexbuffer[6], lVar3 == 0 ||
              (0 < *(int *)(*(long *)&ts_local[0x1b].ch.hexindex + 8))))) {
            Curl_infof((Curl_easy *)ts_local,"Ignoring Transfer-Encoding in CONNECT %03d response",
                       (ulong)(uint)pSStack_40->httpcode);
          }
        }
        else {
          _Var5 = Curl_compareheader(pcStack_30,"Transfer-Encoding:",0x12,"chunked",7);
          if (_Var5) {
            if (((ts_local != (h1_tunnel_state_conflict *)0x0) &&
                ((*(ulong *)(ts_local[0xe].ch.hexbuffer + 0xb) >> 0x1e & 1) != 0)) &&
               ((lVar4._0_1_ = ts_local[0x1b].ch.hexindex,
                lVar4._1_1_ = ts_local[0x1b].ch.hexbuffer[0],
                lVar4._2_1_ = ts_local[0x1b].ch.hexbuffer[1],
                lVar4._3_1_ = ts_local[0x1b].ch.hexbuffer[2],
                lVar4._4_1_ = ts_local[0x1b].ch.hexbuffer[3],
                lVar4._5_1_ = ts_local[0x1b].ch.hexbuffer[4],
                lVar4._6_1_ = ts_local[0x1b].ch.hexbuffer[5],
                lVar4._7_1_ = ts_local[0x1b].ch.hexbuffer[6], lVar4 == 0 ||
                (0 < *(int *)(*(long *)&ts_local[0x1b].ch.hexindex + 8))))) {
              Curl_infof((Curl_easy *)ts_local,"CONNECT responded chunked");
            }
            header_local[0xac] = header_local[0xac] & 0xfeU | 1;
            Curl_httpchunk_reset((Curl_easy *)ts_local,(Curl_chunker *)(header_local + 0x50),true);
          }
        }
      }
    }
    else if (pSStack_40->httpcode / 100 == 2) {
      if (((ts_local != (h1_tunnel_state_conflict *)0x0) &&
          ((*(ulong *)(ts_local[0xe].ch.hexbuffer + 0xb) >> 0x1e & 1) != 0)) &&
         ((lVar2._0_1_ = ts_local[0x1b].ch.hexindex, lVar2._1_1_ = ts_local[0x1b].ch.hexbuffer[0],
          lVar2._2_1_ = ts_local[0x1b].ch.hexbuffer[1], lVar2._3_1_ = ts_local[0x1b].ch.hexbuffer[2]
          , lVar2._4_1_ = ts_local[0x1b].ch.hexbuffer[3],
          lVar2._5_1_ = ts_local[0x1b].ch.hexbuffer[4], lVar2._6_1_ = ts_local[0x1b].ch.hexbuffer[5]
          , lVar2._7_1_ = ts_local[0x1b].ch.hexbuffer[6], lVar2 == 0 ||
          (0 < *(int *)(*(long *)&ts_local[0x1b].ch.hexindex + 8))))) {
        Curl_infof((Curl_easy *)ts_local,"Ignoring Content-Length in CONNECT %03d response",
                   (ulong)(uint)pSStack_40->httpcode);
      }
    }
    else {
      local_58 = pcStack_30 + 0xf;
      iVar6 = Curl_str_numblanks(&local_58,(curl_off_t *)(header_local + 0xa0));
      if (iVar6 != 0) {
        Curl_failf((Curl_easy *)ts_local,"Unsupported Content-Length value");
        return CURLE_WEIRD_SERVER_REPLY;
      }
    }
  }
  else {
    auth._7_1_ = pSStack_40->httpcode == 0x197;
    p = Curl_copy_header_value(pcStack_30);
    if (p == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (((ts_local != (h1_tunnel_state_conflict *)0x0) &&
        ((*(ulong *)(ts_local[0xe].ch.hexbuffer + 0xb) >> 0x1e & 1) != 0)) &&
       (((lVar1._0_1_ = ts_local[0x1b].ch.hexindex, lVar1._1_1_ = ts_local[0x1b].ch.hexbuffer[0],
         lVar1._2_1_ = ts_local[0x1b].ch.hexbuffer[1], lVar1._3_1_ = ts_local[0x1b].ch.hexbuffer[2],
         lVar1._4_1_ = ts_local[0x1b].ch.hexbuffer[3], lVar1._5_1_ = ts_local[0x1b].ch.hexbuffer[4],
         lVar1._6_1_ = ts_local[0x1b].ch.hexbuffer[5], lVar1._7_1_ = ts_local[0x1b].ch.hexbuffer[6],
         lVar1 == 0 || (0 < *(int *)(*(long *)&ts_local[0x1b].ch.hexindex + 8))) &&
        ((data_local != (Curl_easy *)0x0 && (0 < *(int *)(*(long *)data_local + 0xc))))))) {
      Curl_trc_cf_infof((Curl_easy *)ts_local,(Curl_cfilter *)data_local,
                        "CONNECT: fwd auth header \'%s\'",pcStack_30);
    }
    k._4_4_ = Curl_http_input_auth((Curl_easy *)ts_local,(_Bool)(auth._7_1_ & 1),p);
    (*Curl_cfree)(p);
    if (k._4_4_ != CURLE_OK) {
      return k._4_4_;
    }
  }
  return k._4_4_;
}

Assistant:

static CURLcode on_resp_header(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               struct h1_tunnel_state *ts,
                               const char *header)
{
  CURLcode result = CURLE_OK;
  struct SingleRequest *k = &data->req;
  (void)cf;

  if((checkprefix("WWW-Authenticate:", header) &&
      (401 == k->httpcode)) ||
     (checkprefix("Proxy-authenticate:", header) &&
      (407 == k->httpcode))) {

    bool proxy = (k->httpcode == 407);
    char *auth = Curl_copy_header_value(header);
    if(!auth)
      return CURLE_OUT_OF_MEMORY;

    CURL_TRC_CF(data, cf, "CONNECT: fwd auth header '%s'", header);
    result = Curl_http_input_auth(data, proxy, auth);

    free(auth);

    if(result)
      return result;
  }
  else if(checkprefix("Content-Length:", header)) {
    if(k->httpcode/100 == 2) {
      /* A client MUST ignore any Content-Length or Transfer-Encoding
         header fields received in a successful response to CONNECT.
         "Successful" described as: 2xx (Successful). RFC 7231 4.3.6 */
      infof(data, "Ignoring Content-Length in CONNECT %03d response",
            k->httpcode);
    }
    else {
      const char *p = header + strlen("Content-Length:");
      if(Curl_str_numblanks(&p, &ts->cl)) {
        failf(data, "Unsupported Content-Length value");
        return CURLE_WEIRD_SERVER_REPLY;
      }
    }
  }
  else if(Curl_compareheader(header,
                             STRCONST("Connection:"), STRCONST("close")))
    ts->close_connection = TRUE;
  else if(checkprefix("Transfer-Encoding:", header)) {
    if(k->httpcode/100 == 2) {
      /* A client MUST ignore any Content-Length or Transfer-Encoding
         header fields received in a successful response to CONNECT.
         "Successful" described as: 2xx (Successful). RFC 7231 4.3.6 */
      infof(data, "Ignoring Transfer-Encoding in "
            "CONNECT %03d response", k->httpcode);
    }
    else if(Curl_compareheader(header,
                               STRCONST("Transfer-Encoding:"),
                               STRCONST("chunked"))) {
      infof(data, "CONNECT responded chunked");
      ts->chunked_encoding = TRUE;
      /* reset our chunky engine */
      Curl_httpchunk_reset(data, &ts->ch, TRUE);
    }
  }
  else if(Curl_compareheader(header,
                             STRCONST("Proxy-Connection:"),
                             STRCONST("close")))
    ts->close_connection = TRUE;
  else if(!strncmp(header, "HTTP/1.", 7) &&
          ((header[7] == '0') || (header[7] == '1')) &&
          (header[8] == ' ') &&
          ISDIGIT(header[9]) && ISDIGIT(header[10]) && ISDIGIT(header[11]) &&
          !ISDIGIT(header[12])) {
    /* store the HTTP code from the proxy */
    data->info.httpproxycode =  k->httpcode = (header[9] - '0') * 100 +
      (header[10] - '0') * 10 + (header[11] - '0');
  }
  return result;
}